

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpConnection::connect_handler(TcpConnection *this,error_code *error)

{
  element_type *peVar1;
  ostream *poVar2;
  string local_1c0;
  stringstream str;
  ostream local_190 [376];
  
  if (error->_M_value != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar2 = std::operator<<(local_190,"connection error ");
    (**(code **)(*(long *)error->_M_cat + 0x20))(&local_1c0,error->_M_cat,error->_M_value);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
    poVar2 = std::operator<<(poVar2,": code =");
    std::ostream::operator<<(poVar2,error->_M_value);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringbuf::str();
    logger(this,0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    LOCK();
    (this->connectionError)._M_base._M_i = true;
    UNLOCK();
    concurrency::TriggerVariable::activate(&this->connected);
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return;
  }
  (*((this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_Socket[6])();
  concurrency::TriggerVariable::activate(&this->connected);
  peVar1 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_Socket[0xc])(peVar1,1);
  return;
}

Assistant:

void TcpConnection::connect_handler(const std::error_code& error)
{
    if (!error) {
        socket_->handshake();
        connected.activate();
        socket_->set_option_no_delay(true);
    } else {
        std::stringstream str;

        str << "connection error " << error.message()
            << ": code =" << error.value();
        logger(0, str.str());
        connectionError = true;
        connected.activate();
    }
}